

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::InputFile::InputFile(InputFile *this,InputPartData *part)

{
  element_type *peVar1;
  InputPartData *in_RSI;
  Context *in_RDI;
  InputFile *in_stack_000001f0;
  Context *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffe0;
  
  Context::Context(in_RDI,in_stack_ffffffffffffffb8);
  std::make_shared<Imf_3_4::InputFile::Data,Imf_3_4::Context*,int&>
            ((Context **)in_RDI,in_stack_ffffffffffffffe0);
  peVar1 = std::
           __shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f5d30);
  peVar1->_part = in_RSI;
  initialize(in_stack_000001f0);
  return;
}

Assistant:

InputFile::InputFile (InputPartData* part)
    : _ctxt (part->context),
      _data (std::make_shared<Data> (&_ctxt, part->numThreads))
{
    _data->_part = part;
    initialize ();
}